

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

bool __thiscall cmCTestP4::ChangesParser::ProcessLine(ChangesParser *this)

{
  cmCTestP4 *pcVar1;
  bool bVar2;
  string local_30;
  ChangesParser *local_10;
  ChangesParser *this_local;
  
  local_10 = this;
  bVar2 = cmsys::RegularExpression::find(&this->RegexIdentify,&(this->super_LineParser).Line);
  if (bVar2) {
    pcVar1 = this->P4;
    cmsys::RegularExpression::match_abi_cxx11_(&local_30,&this->RegexIdentify,1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pcVar1->ChangeLists,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return true;
}

Assistant:

bool ProcessLine()
    {
    if(this->RegexIdentify.find(this->Line))
      {
      P4->ChangeLists.push_back(this->RegexIdentify.match(1));
      }
    return true;
    }